

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::Texture2DLodControlCase::iterate(Texture2DLodControlCase *this)

{
  ostringstream *this_00;
  TextureFormat TVar1;
  RenderContext *context;
  TestLog *pTVar2;
  int width;
  int height;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RenderTarget *pRVar8;
  int iVar9;
  Surface *pSVar10;
  byte bVar11;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *description;
  int iVar12;
  uint uVar13;
  void *pvVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  PixelFormat *pPVar19;
  undefined1 auVar20 [16];
  uint uVar21;
  uint uVar22;
  uint uVar23;
  RandomViewport viewport;
  int local_448;
  undefined1 local_440 [40];
  TextureRenderer *local_418;
  Surface renderedFrame;
  undefined1 local_3f8 [40];
  undefined1 local_3d0 [40];
  vector<float,_std::allocator<float>_> texCoord;
  Surface referenceFrame;
  undefined1 local_378 [40];
  Surface errorMask;
  LodPrecision lodPrec;
  Texture2DView local_328;
  PixelFormat *local_318;
  Texture2D *local_310;
  LookupPrecision local_308;
  Vector<int,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  _Alloc_hider local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8 [6];
  undefined1 local_248 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218 [4];
  ios_base local_1d0 [268];
  ReferenceParams sampleParams;
  long lVar7;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  local_310 = this->m_texture;
  iVar3 = (local_310->m_refTexture).m_width;
  iVar6 = (local_310->m_refTexture).m_height;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  dVar5 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar4),iVar3 << 2,iVar6 << 2,dVar5);
  glu::mapGLSampler((Sampler *)local_248,0x2901,0x2901,this->m_minFilter,0x2600);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            (&sampleParams,TEXTURETYPE_2D,(Sampler *)local_248,LODMODE_EXACT);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tcu::Surface::Surface(&renderedFrame,viewport.width,viewport.height);
  iVar3 = viewport.width + 3;
  if (-1 < viewport.width) {
    iVar3 = viewport.width;
  }
  iVar6 = viewport.height + 3;
  if (-1 < viewport.height) {
    iVar6 = viewport.height;
  }
  (*this->m_texture->_vptr_Texture2D[2])();
  (**(code **)(lVar7 + 0xb8))(0xde1,this->m_texture->m_glTexture);
  (**(code **)(lVar7 + 0x1360))(0xde1,0x2802,0x2901);
  (**(code **)(lVar7 + 0x1360))(0xde1,0x2803,0x2901);
  (**(code **)(lVar7 + 0x1360))(0xde1,0x2801,this->m_minFilter);
  (**(code **)(lVar7 + 0x1360))(0xde1,0x2800,0x2600);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"After texture setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureMipmapTests.cpp"
                  ,0x5f5);
  iVar3 = iVar3 >> 2;
  iVar6 = iVar6 >> 2;
  local_418 = &this->m_renderer;
  local_448 = 0;
  iVar4 = 0;
  do {
    iVar18 = 0;
    iVar12 = 0;
    for (iVar15 = 0; iVar15 != 4; iVar15 = iVar15 + 1) {
      iVar9 = viewport.width + iVar12;
      if (iVar15 != 3) {
        iVar9 = iVar3;
      }
      iVar16 = viewport.height - iVar4 * iVar6;
      if (iVar4 != 3) {
        iVar16 = iVar6;
      }
      getBasicTexCoord2D(&texCoord,local_448 + iVar15);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                (this,(ulong)(uint)(local_448 + iVar15));
      (**(code **)(lVar7 + 0x1a00))(viewport.x + iVar18,viewport.y + iVar4 * iVar6,iVar9,iVar16);
      iVar12 = iVar12 - iVar3;
      iVar18 = iVar18 + iVar3;
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (local_418,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&sampleParams.super_RenderParams);
    }
    iVar4 = iVar4 + 1;
    local_448 = local_448 + 4;
  } while (iVar4 != 4);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  res.m_data[0] = 8;
  res.m_data[1] = 3;
  pvVar14 = (void *)renderedFrame.m_pixels.m_cap;
  if (renderedFrame.m_pixels.m_cap != 0) {
    pvVar14 = renderedFrame.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_248,(TextureFormat *)&res,renderedFrame.m_width,
             renderedFrame.m_height,1,pvVar14);
  glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)local_248);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"Read pixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureMipmapTests.cpp"
                  ,0x60d);
  pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
  uVar13 = this->m_minFilter;
  tcu::Surface::Surface(&referenceFrame,viewport.width,viewport.height);
  tcu::Surface::Surface(&errorMask,viewport.width,viewport.height);
  pPVar19 = &pRVar8->m_pixelFormat;
  uVar13 = ~(uint)((uVar13 & 0xfffffffe) == 0x2702);
  local_308.colorThreshold.m_data[0] = 0.0;
  local_308.colorThreshold.m_data[1] = 0.0;
  local_308.colorThreshold.m_data[2] = 0.0;
  local_308.colorThreshold.m_data[3] = 0.0;
  local_308.colorMask.m_data[0] = true;
  local_308.colorMask.m_data[1] = true;
  local_308.colorMask.m_data[2] = true;
  local_308.colorMask.m_data[3] = true;
  lodPrec.rule = RULE_OPENGL;
  lodPrec.derivateBits = 0x16;
  lodPrec.lodBits = 0x10;
  local_308.coordBits.m_data[0] = 0x14;
  local_308.coordBits.m_data[1] = 0x14;
  local_308.coordBits.m_data[2] = 0;
  local_308.uvwBits.m_data[0] = 0x10;
  local_308.uvwBits.m_data[1] = 0x10;
  local_308.uvwBits.m_data[2] = 0;
  uVar21 = uVar13 + pPVar19->redBits;
  uVar22 = uVar13 + (pRVar8->m_pixelFormat).greenBits;
  uVar23 = uVar13 + (pRVar8->m_pixelFormat).blueBits;
  uVar13 = uVar13 + (pRVar8->m_pixelFormat).alphaBits;
  res.m_data[1] = -(uint)(0 < (int)uVar22) & uVar22;
  res.m_data[0] = -(uint)(0 < (int)uVar21) & uVar21;
  res.m_data[3] = -(uint)(0 < (int)uVar13) & uVar13;
  res.m_data[2] = -(uint)(0 < (int)uVar23) & uVar23;
  tcu::computeFixedPointThreshold((tcu *)local_248,&res);
  auVar20._0_4_ = -(uint)(0 < pPVar19->redBits);
  auVar20._4_4_ = -(uint)(0 < (pRVar8->m_pixelFormat).greenBits);
  auVar20._8_4_ = -(uint)(0 < (pRVar8->m_pixelFormat).blueBits);
  auVar20._12_4_ = -(uint)(0 < (pRVar8->m_pixelFormat).alphaBits);
  uVar13 = movmskps((int)local_248,auVar20);
  bVar11 = (byte)uVar13;
  local_308.colorMask.m_data =
       (bool  [4])
       (uVar13 & 1 | (uint)((bVar11 & 2) >> 1) << 8 | (uint)((bVar11 & 4) >> 2) << 0x10 |
       (uint)(bVar11 >> 3) << 0x18);
  lodPrec.derivateBits = 10;
  lodPrec.lodBits = 8;
  iVar4 = 0;
  iVar12 = 0;
  iVar15 = 0;
  local_318 = pPVar19;
  do {
    iVar18 = iVar12 * iVar6;
    iVar16 = 0;
    iVar9 = 0;
    iVar17 = 0;
    local_418 = (TextureRenderer *)CONCAT44(local_418._4_4_,iVar12);
    do {
      width = viewport.width + iVar9;
      if (iVar17 != 3) {
        width = iVar3;
      }
      height = viewport.height - iVar18;
      if (iVar12 != 3) {
        height = iVar6;
      }
      getBasicTexCoord2D(&texCoord,iVar4 + iVar17);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                (this,&sampleParams,(ulong)(uint)(iVar4 + iVar17));
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)local_248,&referenceFrame,local_318,iVar16,iVar18,width,height);
      res.m_data._8_8_ = (local_310->m_refTexture).m_view.m_levels;
      res.m_data[0] = (local_310->m_refTexture).m_view.m_numLevels;
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)local_248,(Texture2DView *)&res,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&sampleParams);
      local_440._0_4_ = RGBA;
      local_440._4_4_ = UNORM_INT8;
      pvVar14 = (void *)renderedFrame.m_pixels.m_cap;
      if (renderedFrame.m_pixels.m_cap != 0) {
        pvVar14 = renderedFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&res,(TextureFormat *)local_440,renderedFrame.m_width,
                 renderedFrame.m_height,1,pvVar14);
      tcu::getSubregion((PixelBufferAccess *)local_248,(PixelBufferAccess *)&res,iVar16,iVar18,width
                        ,height);
      local_3f8._0_4_ = RGBA;
      local_3f8._4_4_ = UNORM_INT8;
      pvVar14 = (void *)referenceFrame.m_pixels.m_cap;
      if (referenceFrame.m_pixels.m_cap != 0) {
        pvVar14 = referenceFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_3d0,(TextureFormat *)local_3f8,referenceFrame.m_width,
                 referenceFrame.m_height,1,pvVar14);
      tcu::getSubregion((PixelBufferAccess *)local_440,(PixelBufferAccess *)local_3d0,iVar16,iVar18,
                        width,height);
      local_328.m_numLevels = 8;
      local_328._4_4_ = 3;
      pvVar14 = (void *)errorMask.m_pixels.m_cap;
      if (errorMask.m_pixels.m_cap != 0) {
        pvVar14 = errorMask.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_378,(TextureFormat *)&local_328,errorMask.m_width,
                 errorMask.m_height,1,pvVar14);
      tcu::getSubregion((PixelBufferAccess *)local_3f8,(PixelBufferAccess *)local_378,iVar16,iVar18,
                        width,height);
      local_328.m_levels = (this->m_texture->m_refTexture).m_view.m_levels;
      local_328.m_numLevels = (this->m_texture->m_refTexture).m_view.m_numLevels;
      iVar12 = glu::TextureTestUtil::computeTextureLookupDiff
                         ((ConstPixelBufferAccess *)local_248,(ConstPixelBufferAccess *)local_440,
                          (PixelBufferAccess *)local_3f8,&local_328,
                          texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,&sampleParams,&local_308,&lodPrec,
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                          m_watchDog);
      iVar17 = iVar17 + 1;
      iVar15 = iVar15 + iVar12;
      iVar9 = iVar9 - iVar3;
      iVar16 = iVar16 + iVar3;
      iVar12 = (int)local_418;
    } while (iVar17 != 4);
    iVar12 = (int)local_418 + 1;
    iVar4 = iVar4 + 4;
  } while (iVar12 != 4);
  if (0 < iVar15) {
    local_248._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_248 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"ERROR: Image verification failed, found ",0x28);
    std::ostream::operator<<(this_00,iVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," invalid pixels!",0x10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_1d0);
  }
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_440._0_8_ = (long)local_440 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"Result","");
  local_3d0._0_8_ = (long)local_3d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"Verification result","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)&res,(string *)local_440,(string *)local_3d0);
  tcu::TestLog::startImageSet(pTVar2,(char *)res.m_data._0_8_,local_2b8._M_p);
  local_3f8._0_8_ = (long)local_3f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"Rendered","");
  TVar1 = (TextureFormat)((long)local_378 + 0x10);
  local_378._0_8_ = TVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"Rendered image","");
  pSVar10 = &renderedFrame;
  tcu::LogImage::LogImage
            ((LogImage *)local_248,(string *)local_3f8,(string *)local_378,pSVar10,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_248,(int)pTVar2,__buf,(size_t)pSVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_p != local_218) {
    operator_delete(local_228._M_p,local_218[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._0_8_ != &local_238) {
    operator_delete((void *)local_248._0_8_,local_238._M_allocated_capacity + 1);
  }
  if ((TextureFormat)local_378._0_8_ != TVar1) {
    operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
  }
  if (local_3f8._0_8_ != (long)local_3f8 + 0x10) {
    operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_p != local_2a8) {
    operator_delete(local_2b8._M_p,local_2a8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res.m_data._0_8_ != &local_2c8) {
    operator_delete((void *)res.m_data._0_8_,local_2c8._M_allocated_capacity + 1);
  }
  if (local_3d0._0_8_ != (long)local_3d0 + 0x10) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  if (local_440._0_8_ != (long)local_440 + 0x10) {
    operator_delete((void *)local_440._0_8_,local_440._16_8_ + 1);
  }
  if (0 < iVar15) {
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_440._0_8_ = (long)local_440 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"Reference","");
    local_3d0._0_8_ = (long)local_3d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"Ideal reference","");
    pSVar10 = &referenceFrame;
    tcu::LogImage::LogImage
              ((LogImage *)local_248,(string *)local_440,(string *)local_3d0,pSVar10,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    iVar3 = (int)pTVar2;
    tcu::LogImage::write((LogImage *)local_248,iVar3,__buf_00,(size_t)pSVar10);
    local_3f8._0_8_ = (long)local_3f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"ErrorMask","");
    local_378._0_8_ = TVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"Error mask","");
    pSVar10 = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)&res,(string *)local_3f8,(string *)local_378,pSVar10,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&res,iVar3,__buf_01,(size_t)pSVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_p != local_2a8) {
      operator_delete(local_2b8._M_p,local_2a8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)res.m_data._0_8_ != &local_2c8) {
      operator_delete((void *)res.m_data._0_8_,local_2c8._M_allocated_capacity + 1);
    }
    if ((TextureFormat)local_378._0_8_ != TVar1) {
      operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
    }
    if (local_3f8._0_8_ != (long)local_3f8 + 0x10) {
      operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_p != local_218) {
      operator_delete(local_228._M_p,local_218[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._0_8_ != &local_238) {
      operator_delete((void *)local_248._0_8_,local_238._M_allocated_capacity + 1);
    }
    if (local_3d0._0_8_ != (long)local_3d0 + 0x10) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if (local_440._0_8_ != (long)local_440 + 0x10) {
      operator_delete((void *)local_440._0_8_,local_440._16_8_ + 1);
    }
  }
  tcu::TestLog::endImageSet(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log)
  ;
  description = "Pass";
  if (iVar15 != 0) {
    description = "Image verification failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(iVar15 != 0),
             description);
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&referenceFrame);
  tcu::Surface::~Surface(&renderedFrame);
  if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

Texture2DLodControlCase::IterateResult Texture2DLodControlCase::iterate (void)
{
	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();

	const deUint32				wrapS				= GL_REPEAT;
	const deUint32				wrapT				= GL_REPEAT;
	const deUint32				magFilter			= GL_NEAREST;

	const tcu::Texture2D&		refTexture			= m_texture->getRefTexture();
	const int					texWidth			= refTexture.getWidth();
	const int					texHeight			= refTexture.getHeight();

	const tcu::RenderTarget&	renderTarget		= m_context.getRenderContext().getRenderTarget();
	const RandomViewport		viewport			(renderTarget, texWidth*4, texHeight*4, deStringHash(getName()));

	ReferenceParams				sampleParams		(TEXTURETYPE_2D, glu::mapGLSampler(wrapS, wrapT, m_minFilter, magFilter));
	vector<float>				texCoord;
	tcu::Surface				renderedFrame		(viewport.width, viewport.height);

	// Viewport is divided into 4x4 grid.
	const int					gridWidth			= 4;
	const int					gridHeight			= 4;
	const int					cellWidth			= viewport.width / gridWidth;
	const int					cellHeight			= viewport.height / gridHeight;

	// Upload texture data.
	m_texture->upload();

	// Bind gradient texture and setup sampler parameters.
	gl.bindTexture	(GL_TEXTURE_2D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			int				curX		= cellWidth*gridX;
			int				curY		= cellHeight*gridY;
			int				curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
			int				curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
			int				cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			getBasicTexCoord2D(texCoord, cellNdx);

			// Render with GL.
			setTextureParams(cellNdx);
			gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
			m_renderer.renderQuad(0, &texCoord[0], sampleParams);
		}
	}

	glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, renderedFrame.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels");

	// Compare and log.
	{
		const tcu::PixelFormat&	pixelFormat		= m_context.getRenderTarget().getPixelFormat();
		const bool				isTrilinear		= m_minFilter == GL_NEAREST_MIPMAP_LINEAR || m_minFilter == GL_LINEAR_MIPMAP_LINEAR;
		tcu::Surface			referenceFrame	(viewport.width, viewport.height);
		tcu::Surface			errorMask		(viewport.width, viewport.height);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_OPENGL);
		int						numFailedPixels	= 0;

		lookupPrec.coordBits		= tcu::IVec3(20, 20, 0);
		lookupPrec.uvwBits			= tcu::IVec3(16, 16, 0); // Doesn't really matter since pixels are unicolored.
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat) - (isTrilinear ? 2 : 1), tcu::IVec4(0)));
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= 8;

		for (int gridY = 0; gridY < gridHeight; gridY++)
		{
			for (int gridX = 0; gridX < gridWidth; gridX++)
			{
				const int		curX		= cellWidth*gridX;
				const int		curY		= cellHeight*gridY;
				const int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
				const int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
				const int		cellNdx		= gridY*gridWidth + gridX;

				getBasicTexCoord2D(texCoord, cellNdx);
				getReferenceParams(sampleParams, cellNdx);

				// Render ideal result
				sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat, curX, curY, curW, curH),
							  refTexture, &texCoord[0], sampleParams);

				// Compare this cell
				numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
															m_texture->getRefTexture(), &texCoord[0], sampleParams,
															lookupPrec, lodPrec, m_testCtx.getWatchDog());
			}
		}

		if (numFailedPixels > 0)
			m_testCtx.getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::ImageSet("Result", "Verification result")
							<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_testCtx.getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
								<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_testCtx.getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image verification failed");
		}
	}

	return STOP;
}